

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_allreduce_qtree_single
          (bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,bsc_pid_t q)

{
  long lVar1;
  int iVar2;
  bsp_pid_t bVar3;
  void *dst_00;
  void *local_b0;
  bsc_pid_t local_98;
  void *local_90;
  int local_78;
  char *gather;
  void *accum;
  char *tmp_bytes;
  bsc_pid_t s;
  bsc_pid_t range;
  bsc_pid_t P;
  bsc_pid_t k;
  bsc_pid_t j;
  bsc_pid_t i;
  group_t *g;
  bsc_reduce_t reducer_local;
  void *tmp_space_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
    local_78 = bsp_pid();
  }
  else {
    iVar2 = *group;
    lVar1 = *(long *)((long)group + 8);
    bVar3 = bsp_pid();
    local_78 = *(int *)(lVar1 + (long)bVar3 * 4);
  }
  dst_00 = (void *)((long)tmp_space + (long)size);
  local_90 = tmp_space;
  if (iVar2 == 1) {
    local_90 = dst;
  }
  (*reducer)(local_90,zero,src,size * nmemb);
  group_local._4_4_ = depends;
  for (tmp_bytes._4_4_ = 1; tmp_bytes._4_4_ < iVar2; tmp_bytes._4_4_ = q * tmp_bytes._4_4_) {
    range = 1;
    for (k = 1; k < q; k = k + 1) {
      if (k * tmp_bytes._4_4_ < iVar2) {
        local_98 = (k * tmp_bytes._4_4_ + local_78) % iVar2;
        if (group != (bsc_group_t)0x0) {
          local_98 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)local_98 * 4);
        }
        bsc_get(group_local._4_4_,local_98,tmp_space,0,(void *)((long)dst_00 + (long)(range * size))
                ,size);
        range = range + 1;
      }
    }
    bVar3 = bsp_pid();
    bsc_get(group_local._4_4_,bVar3,tmp_space,0,dst_00,size);
    local_b0 = tmp_space;
    if (iVar2 <= tmp_bytes._4_4_ * q) {
      local_b0 = dst;
    }
    bsc_exec_reduce(group_local._4_4_,reducer,local_b0,zero,dst_00,size * range);
    group_local._4_4_ = group_local._4_4_ + 1;
  }
  return group_local._4_4_;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_allreduce_qtree_single( 
        bsc_step_t depends, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size, 
        bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, s = g?g->lid[bsp_pid()]:bsp_pid();
    char * tmp_bytes = tmp_space;
    void * accum = tmp_bytes;
    char * gather = tmp_bytes + size;

    (*reducer)( P==1?dst:accum, zero, src, size * nmemb );

    for (range = 1; range < P; range *= q ) {
        k = 1;
        for ( i = 1 ; i < q; ++i) {
            if (i * range < P) {
                j = (i * range + s)%P; 
                bsc_get( depends, g?g->gid[j]:j, accum, 0,
                        &gather[k * size], size);
                k+=1;
            }
        }
        bsc_get( depends, bsp_pid(), accum, 0, gather, size );
        bsc_exec_reduce( depends, reducer, range*q>=P?dst:accum, zero, gather, size*k );
        depends += 1;
    }
    return depends;
}